

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

void nni_http_server_close(nni_http_server *s)

{
  int iVar1;
  
  nni_mtx_lock(&s->mtx);
  if ((s->starts == 0) || (iVar1 = s->starts + -1, s->starts = iVar1, iVar1 == 0)) {
    http_server_close(s);
  }
  nni_mtx_unlock(&s->mtx);
  return;
}

Assistant:

void
nni_http_server_close(nni_http_server *s)
{
	nni_mtx_lock(&s->mtx);
	if (s->starts != 0) {
		s->starts--;
	}
	if (s->starts == 0) {
		http_server_close(s);
	}
	nni_mtx_unlock(&s->mtx);
}